

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O2

void update_aspa(aspa_table *s,aspa_record record,rtr_socket *rtr_sockt,
                aspa_operation_type operation_type)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((print_all_aspa_updates) || (*(char *)((long)&rtr_sockt[1].pfx_table + 6) == '\x01')) {
    pthread_mutex_lock((pthread_mutex_t *)&stdout_mutex);
    printf("HOST:  %s:%s\n",rtr_sockt[1].connection_state_fp,
           rtr_sockt[1].connection_state_fp_param_config);
    uVar2 = 0x3f;
    if (operation_type == ASPA_REMOVE) {
      uVar2 = 0x2d;
    }
    uVar3 = 0x2b;
    if (operation_type != ASPA_ADD) {
      uVar3 = uVar2;
    }
    printf("%c ASPA %u => [ ",uVar3,(ulong)record.customer_asn);
    for (uVar4 = 0; record.provider_count != uVar4; uVar4 = uVar4 + 1) {
      printf("%u",(ulong)record.provider_asns[uVar4]);
      if (uVar4 < record.provider_count - 1) {
        printf(", ");
      }
    }
    puts(" ]");
    pthread_mutex_unlock((pthread_mutex_t *)&stdout_mutex);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      free(record.provider_asns);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void update_aspa(struct aspa_table *s __attribute__((unused)), const struct aspa_record record,
			const struct rtr_socket *rtr_sockt, const enum aspa_operation_type operation_type)
{
	const struct socket_config *config = (const struct socket_config *)rtr_sockt;

	if (!print_all_aspa_updates && !config->print_aspa_updates)
		return;

	pthread_mutex_lock(&stdout_mutex);

	printf("HOST:  %s:%s\n", config->host, config->port);

	char c;

	switch (operation_type) {
	case ASPA_ADD:
		c = '+';
		break;
	case ASPA_REMOVE:
		c = '-';
		break;
	default:
		c = '?';
		break;
	}

	printf("%c ASPA %u => [ ", c, record.customer_asn);

	size_t i;
	size_t count = record.provider_count;

	for (i = 0; i < count; i++) {
		printf("%u", record.provider_asns[i]);
		if (i < count - 1)
			printf(", ");
	}

	printf(" ]\n");
	pthread_mutex_unlock(&stdout_mutex);
	free(record.provider_asns);
}